

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O1

Extra_UnateInfo_t * Extra_UnateComputeSlow(DdManager *dd,DdNode *bFunc)

{
  int iVar1;
  DdNode *n;
  Extra_UnateInfo_t *pEVar2;
  Extra_UnateVar_t *__s;
  Extra_UnateVar_t EVar3;
  uint uVar4;
  DdNode *pDVar5;
  
  n = Cudd_Support(dd,bFunc);
  Cudd_Ref(n);
  iVar1 = Extra_bddSuppSize(dd,n);
  pEVar2 = (Extra_UnateInfo_t *)malloc(0x18);
  pEVar2->nVars = 0;
  pEVar2->nVarsMax = 0;
  *(undefined8 *)&pEVar2->nUnate = 0;
  pEVar2->pVars = (Extra_UnateVar_t *)0x0;
  pEVar2->nVars = iVar1;
  __s = (Extra_UnateVar_t *)malloc((long)iVar1 << 2);
  pEVar2->pVars = __s;
  memset(__s,0,(long)iVar1 << 2);
  pEVar2->nVarsMax = dd->size;
  pDVar5 = n;
  if (n != dd->one) {
    do {
      iVar1 = Extra_bddCheckUnateNaive(dd,bFunc,pDVar5->index);
      EVar3 = (Extra_UnateVar_t)((uint)*__s & 0xc0000000 | pDVar5->index & 0x3fffffff);
      *__s = EVar3;
      if (iVar1 == -1) {
        uVar4 = 0x80000000;
LAB_00806cd5:
        *__s = (Extra_UnateVar_t)((uint)EVar3 | uVar4);
      }
      else if (iVar1 == 1) {
        uVar4 = 0x40000000;
        goto LAB_00806cd5;
      }
      pEVar2->nUnate = (pEVar2->nUnate + 1) - (uint)(iVar1 == 0);
      pDVar5 = (pDVar5->type).kids.T;
      __s = __s + 1;
    } while (pDVar5 != dd->one);
  }
  Cudd_RecursiveDeref(dd,n);
  return pEVar2;
}

Assistant:

Extra_UnateInfo_t * Extra_UnateComputeSlow( DdManager * dd, DdNode * bFunc )
{
    int nSuppSize;
    DdNode * bSupp, * bTemp;
    Extra_UnateInfo_t * p;
    int i, Res;

    // compute the support
    bSupp = Cudd_Support( dd, bFunc );   Cudd_Ref( bSupp );
    nSuppSize = Extra_bddSuppSize( dd, bSupp );
//printf( "Support = %d. ", nSuppSize );
//Extra_bddPrint( dd, bSupp );
//printf( "%d ", nSuppSize );

    // allocate the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        Res = Extra_bddCheckUnateNaive( dd, bFunc, bTemp->index );
        p->pVars[i].iVar = bTemp->index;
        if ( Res == -1 )
            p->pVars[i].Neg = 1;
        else if ( Res == 1 )
            p->pVars[i].Pos = 1;
        p->nUnate += (Res != 0);
    }
    Cudd_RecursiveDeref( dd, bSupp );
    return p;

}